

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

size_t __thiscall flexbuffers::Builder::EndVector(Builder *this,size_t start,bool typed,bool fixed)

{
  Value vec;
  
  vec = CreateVector(this,start,
                     ((long)(this->stack_).
                            super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->stack_).
                            super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) - start,1,typed,fixed,
                     (Value *)0x0);
  std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::resize
            (&this->stack_,start);
  std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::push_back
            (&this->stack_,&vec);
  return vec.field_0.i_;
}

Assistant:

size_t EndVector(size_t start, bool typed, bool fixed) {
    auto vec = CreateVector(start, stack_.size() - start, 1, typed, fixed);
    // Remove temp elements and return vector.
    stack_.resize(start);
    stack_.push_back(vec);
    return static_cast<size_t>(vec.u_);
  }